

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

Gla_Man_t * Gla_ManStart(Gia_Man_t *pGia0,Abs_Par_t *pPars)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Abs_Par_t *pAVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Gla_Man_t *p;
  Vec_Int_t *pVVar9;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar10;
  Gia_Man_t *p_00;
  int *piVar11;
  int *__s;
  Gia_Obj_t *pGVar12;
  int *piVar13;
  Gla_Obj_t *pGVar14;
  uint *__s_00;
  Gia_Obj_t *pGVar15;
  Gla_Obj_t *pGVar16;
  sat_solver2 *psVar17;
  Vec_Set_t *pVVar18;
  word **ppwVar19;
  word *pwVar20;
  Rnm_Man_t *pRVar21;
  uint uVar22;
  long lVar23;
  Gla_Obj_t *pGVar24;
  bool bVar25;
  long lVar26;
  size_t __size;
  ulong uVar27;
  
  p = (Gla_Man_t *)calloc(1,0xd0);
  p->pGia0 = pGia0;
  p->pPars = pPars;
  pVVar9 = Vec_IntAlloc(100);
  p->vAbs = pVVar9;
  pVVar9 = Vec_IntAlloc(100);
  p->vTemp = pVVar9;
  pVVar9 = Vec_IntAlloc(100);
  p->vAddedNew = pVVar9;
  pVVar9 = Vec_IntAlloc(100);
  p->vObjCounts = pVVar9;
  pAig = Gia_ManToAigSimple(pGia0);
  pCVar10 = Cnf_DeriveOther(pAig,1);
  p->pCnf = pCVar10;
  Aig_ManStop(pAig);
  p_00 = Gia_ManDupMapped(pGia0,pCVar10->vMapping);
  p->pGia = p_00;
  if (pPars->fPropFanout != 0) {
    Gia_ManStaticFanoutStart(p_00);
  }
  if (pGia0->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("pGia0->vGateClasses != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x355,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  pVVar9 = Vec_IntStart(p_00->nObjs);
  p_00->vGateClasses = pVVar9;
  pVVar9 = Vec_IntStart(p_00->nObjs);
  p->vCoreCounts = pVVar9;
  lVar23 = 0;
  pVVar9 = Vec_IntAlloc(0);
  p->vProofIds = pVVar9;
  pVVar9 = Vec_IntStart(p_00->nObjs);
  __size = (long)p_00->nObjs << 2;
  piVar11 = (int *)malloc(__size);
  memset(piVar11,0xff,__size);
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  uVar22 = 1;
  while ((iVar7 = (int)lVar23, lVar23 < pGia0->nObjs &&
         (pGVar12 = Gia_ManObj(pGia0,iVar7), pGVar12 != (Gia_Obj_t *)0x0))) {
    if (pGVar12->Value != 0xffffffff) {
      iVar5 = Abc_LitIsCompl(pGVar12->Value);
      if (iVar5 != 0) {
        __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x364,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      uVar6 = Abc_Lit2Var(pGVar12->Value);
      pGVar12->Value = uVar6;
      if (p_00->nObjs <= (int)uVar6) {
        __assert_fail("(int)pObj->Value < Gia_ManObjNum(p->pGia)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x366,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      piVar11[uVar6] = pCVar10->pObj2Count[lVar23];
      __s[pGVar12->Value] = pCVar10->pObj2Clause[lVar23];
      iVar5 = Vec_IntEntry(pGia0->vGateClasses,iVar7);
      if (iVar5 != 0) {
        Vec_IntWriteEntry(p_00->vGateClasses,pGVar12->Value,1);
      }
      iVar7 = Vec_IntEntry(pCVar10->vMapping,iVar7);
      Vec_IntWriteEntry(pVVar9,pGVar12->Value,pVVar9->nSize);
      piVar13 = Vec_IntEntryP(pCVar10->vMapping,iVar7);
      Vec_IntPush(pVVar9,*piVar13);
      for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
        uVar6 = 0xffffffff;
        if (piVar13[lVar26 + 1] != -1) {
          pGVar12 = Gia_ManObj(pGia0,piVar13[lVar26 + 1]);
          if (pGVar12->Value == 0xffffffff) {
            __assert_fail("~Gia_ManObj(pGia0, pMapping[k])->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                          ,0x377,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
          }
          pGVar12 = Gia_ManObj(pGia0,piVar13[lVar26 + 1]);
          uVar6 = pGVar12->Value;
        }
        Vec_IntPush(pVVar9,uVar6);
      }
    }
    lVar23 = lVar23 + 1;
  }
  Vec_IntFree(pCVar10->vMapping);
  pCVar10->vMapping = pVVar9;
  free(pCVar10->pObj2Count);
  pCVar10->pObj2Count = piVar11;
  free(pCVar10->pObj2Clause);
  pCVar10->pObj2Clause = __s;
  p->nObjs = 1;
  lVar23 = 0;
  while ((lVar23 < p_00->nObjs &&
         (pGVar12 = Gia_ManObj(p_00,(int)lVar23), pGVar12 != (Gia_Obj_t *)0x0))) {
    if (pCVar10->pObj2Count[lVar23] < 0) {
      uVar6 = 0xffffffff;
    }
    else {
      p->nObjs = uVar22 + 1;
      uVar6 = uVar22;
      uVar22 = uVar22 + 1;
    }
    pGVar12->Value = uVar6;
    lVar23 = lVar23 + 1;
  }
  piVar11 = *pCVar10->pClauses;
  for (lVar23 = 0; lVar23 < pCVar10->nLiterals; lVar23 = lVar23 + 1) {
    pGVar12 = Gia_ManObj(pGia0,piVar11[lVar23] >> 1);
    if (pGVar12->Value == 0xffffffff) {
      __assert_fail("~pObj->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                    ,0x390,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
    }
    pGVar12 = Gia_ManObj(p_00,pGVar12->Value);
    if (pGVar12->Value == 0xffffffff) {
      __assert_fail("~pObj->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                    ,0x393,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
    }
    piVar11[lVar23] = (piVar11[lVar23] & 1U) + pGVar12->Value * 2;
  }
  pGVar14 = (Gla_Obj_t *)calloc((long)(int)uVar22,0x28);
  p->pObjs = pGVar14;
  uVar27 = (ulong)p_00->nObjs;
  __s_00 = (uint *)malloc(uVar27 << 2);
  pGVar12 = (Gia_Obj_t *)0xff;
  memset(__s_00,0xff,uVar27 << 2);
  p->pObj2Obj = __s_00;
  for (lVar23 = 0; iVar7 = (int)pGVar12, lVar23 < (int)uVar27; lVar23 = lVar23 + 1) {
    iVar5 = (int)lVar23;
    iVar7 = iVar5;
    pGVar15 = Gia_ManObj(p_00,iVar5);
    if (pGVar15 == (Gia_Obj_t *)0x0) break;
    uVar6 = pGVar15->Value;
    __s_00[lVar23] = uVar6;
    pGVar12 = (Gia_Obj_t *)(ulong)uVar6;
    if (uVar6 != 0xffffffff) {
      pGVar16 = Gla_ManObj(p,uVar6);
      pGVar16->iGiaObj = iVar5;
      uVar6 = *(uint *)&pGVar16->field_0x4;
      uVar8 = *(uint *)pGVar15 >> 0x1c & 2;
      *(uint *)&pGVar16->field_0x4 = uVar6 & 0xfffffffd | uVar8;
      *(uint *)&pGVar16->field_0x4 =
           (uVar6 & 0xfffffff9 | uVar8) + (uint)((~*(ulong *)pGVar15 & 0x1fffffff1fffffff) == 0) * 4
      ;
      iVar7 = Gia_ObjIsPi(p_00,pGVar15);
      *(uint *)&pGVar16->field_0x4 = (*(uint *)&pGVar16->field_0x4 & 0xfffffff7) + iVar7 * 8;
      iVar7 = Gia_ObjIsPo(p_00,pGVar15);
      *(uint *)&pGVar16->field_0x4 = *(uint *)&pGVar16->field_0x4 & 0xffffffef | iVar7 << 4;
      iVar7 = Gia_ObjIsRi(p_00,pGVar15);
      *(uint *)&pGVar16->field_0x4 = *(uint *)&pGVar16->field_0x4 & 0xffffffbf | iVar7 << 6;
      pGVar12 = pGVar15;
      iVar7 = Gia_ObjIsRo(p_00,pGVar15);
      uVar6 = *(uint *)&pGVar16->field_0x4 & 0xffffffdf | iVar7 << 5;
      *(uint *)&pGVar16->field_0x4 = uVar6;
      *(uint *)&pGVar16->field_0x4 =
           uVar6 & 0xffffff7f |
           (uint)((~*(uint *)pGVar15 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar15) << 7;
      if (((~*(ulong *)pGVar15 & 0x1fffffff1fffffff) != 0) &&
         (pGVar12 = pGVar15, iVar7 = Gia_ObjIsPi(p_00,pGVar15), iVar7 == 0)) {
        iVar7 = (int)*(ulong *)pGVar15;
        uVar27 = *(ulong *)pGVar15 & 0x1fffffff;
        bVar25 = uVar27 == 0x1fffffff || -1 < iVar7;
        if (bVar25) {
          if (iVar7 < 0 || (int)uVar27 == 0x1fffffff) {
            iVar7 = Gia_ObjIsRo(p_00,pGVar15);
            if (iVar7 == 0) {
              __assert_fail("Gia_ObjIsRo(p->pGia, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                            ,0x3bf,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
            }
            *(uint *)&pGVar16->field_0x4 = *(uint *)&pGVar16->field_0x4 & 0x1ff | 0x200;
            pGVar12 = Gia_ObjRoToRi(p_00,pGVar15);
            pGVar16->Fanins[0] = pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].Value;
            pGVar12 = Gia_ObjRoToRi(p_00,pGVar15);
            *(uint *)&pGVar16->field_0x4 =
                 *(uint *)&pGVar16->field_0x4 & 0xfffffffd | *(uint *)pGVar12 >> 0x1c & 2;
            pGVar12 = pGVar15;
          }
          else {
            uVar6 = Vec_IntEntry(pCVar10->vMapping,iVar5);
            pGVar12 = (Gia_Obj_t *)(ulong)uVar6;
            piVar11 = Vec_IntEntryP(pCVar10->vMapping,uVar6);
            *(uint *)&pGVar16->field_0x4 = *(uint *)&pGVar16->field_0x4 & 0x1ff;
            for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
              uVar6 = piVar11[lVar26 + 1];
              pGVar12 = (Gia_Obj_t *)(ulong)uVar6;
              if (uVar6 != 0xffffffff) {
                pGVar15 = Gia_ManObj(p_00,uVar6);
                uVar6 = pGVar15->Value;
                uVar8 = *(uint *)&pGVar16->field_0x4;
                *(uint *)&pGVar16->field_0x4 = uVar8 + 0x200;
                pGVar16->Fanins[uVar8 >> 9] = uVar6;
              }
            }
          }
        }
        else {
          *(uint *)&pGVar16->field_0x4 = *(uint *)&pGVar16->field_0x4 & 0x1ff | 0x200;
          pGVar16->Fanins[0] = pGVar15[-(ulong)((uint)*(undefined8 *)pGVar15 & 0x1fffffff)].Value;
          pGVar12 = (Gia_Obj_t *)CONCAT71(0x1fffff,bVar25);
        }
      }
    }
    uVar27 = (ulong)(uint)p_00->nObjs;
  }
  pGVar12 = Gia_ManPo(p_00,iVar7);
  pGVar16 = Gla_ManObj(p,pGVar12->Value);
  p->pObjRoot = pGVar16;
  pGVar16 = pGVar14;
  if (p_00->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("p->pGia->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x3c6,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  do {
    do {
      pGVar24 = pGVar16;
      pGVar16 = pGVar24 + 1;
      if (pGVar14 + (int)uVar22 <= pGVar16) {
        psVar17 = sat_solver2_new();
        p->pSat = psVar17;
        if (pPars->fUseFullProof != 0) {
          pVVar18 = (Vec_Set_t *)calloc(1,0x20);
          pVVar18->nPageSize = 0x14;
          pVVar18->uPageMask = 0xfffff;
          pVVar18->nPagesAlloc = 0x100;
          ppwVar19 = (word **)calloc(0x100,8);
          pVVar18->pPages = ppwVar19;
          pwVar20 = (word *)malloc(0x800000);
          pwVar20[1] = 0xffffffffffffffff;
          *ppwVar19 = pwVar20;
          *pwVar20 = 2;
          psVar17->pPrf1 = pVVar18;
        }
        pAVar4 = p->pPars;
        uVar2 = pAVar4->nLearnedDelta;
        uVar3 = pAVar4->nLearnedPerce;
        iVar7 = pAVar4->nLearnedStart;
        psVar17->nLearntMax = iVar7;
        psVar17->nLearntStart = iVar7;
        psVar17->nLearntDelta = uVar2;
        psVar17->nLearntRatio = uVar3;
        p->nSatVars = 1;
        pRVar21 = Rnm_ManStart(p->pGia);
        p->pRnm = pRVar21;
        return p;
      }
      iVar7 = Vec_IntEntry(p->pGia->vGateClasses,pGVar16->iGiaObj);
    } while (iVar7 == 0);
    puVar1 = &pGVar24[1].field_0x4;
    *puVar1 = *puVar1 | 1;
    pVVar9 = p->vAbs;
    iVar7 = Gla_ObjId(p,pGVar16);
    Vec_IntPush(pVVar9,iVar7);
    pGVar14 = p->pObjs;
    uVar22 = p->nObjs;
  } while( true );
}

Assistant:

Gla_Man_t * Gla_ManStart( Gia_Man_t * pGia0, Abs_Par_t * pPars )
{
    Gla_Man_t * p;
    Aig_Man_t * pAig;
    Gia_Obj_t * pObj;
    Gla_Obj_t * pGla;
    Vec_Int_t * vMappingNew;
    int i, k, Offset, * pMapping, * pLits, * pObj2Count, * pObj2Clause;

    // start
    p = ABC_CALLOC( Gla_Man_t, 1 );
    p->pGia0 = pGia0;
    p->pPars = pPars;
    p->vAbs  = Vec_IntAlloc( 100 );
    p->vTemp = Vec_IntAlloc( 100 );
    p->vAddedNew = Vec_IntAlloc( 100 );
    p->vObjCounts = Vec_IntAlloc( 100 );

    // internal data
    pAig = Gia_ManToAigSimple( pGia0 );
    p->pCnf = Cnf_DeriveOther( pAig, 1 );
    Aig_ManStop( pAig );
    // create working GIA
    p->pGia = Gia_ManDupMapped( pGia0, p->pCnf->vMapping );
    if ( pPars->fPropFanout )
        Gia_ManStaticFanoutStart( p->pGia );

    // derive new gate map
    assert( pGia0->vGateClasses != 0 );
    p->pGia->vGateClasses = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vCoreCounts = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vProofIds = Vec_IntAlloc(0);
    // update p->pCnf->vMapping, p->pCnf->pObj2Count, p->pCnf->pObj2Clause 
    // (here are not updating p->pCnf->pVarNums because it is not needed)
    vMappingNew = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( pGia0, pObj, i )
    {
        // skip internal nodes not used in the mapping
        if ( !~pObj->Value )
            continue;
        // replace positive literal by variable
        assert( !Abc_LitIsCompl(pObj->Value) );
        pObj->Value = Abc_Lit2Var(pObj->Value);
        assert( (int)pObj->Value < Gia_ManObjNum(p->pGia) );
        // update arrays
        pObj2Count[pObj->Value] = p->pCnf->pObj2Count[i];
        pObj2Clause[pObj->Value] = p->pCnf->pObj2Clause[i];
        if ( Vec_IntEntry(pGia0->vGateClasses, i) )
            Vec_IntWriteEntry( p->pGia->vGateClasses, pObj->Value, 1 );
        // update mappings
        Offset = Vec_IntEntry(p->pCnf->vMapping, i);
        Vec_IntWriteEntry( vMappingNew, pObj->Value, Vec_IntSize(vMappingNew) );
        pMapping = Vec_IntEntryP(p->pCnf->vMapping, Offset);
        Vec_IntPush( vMappingNew, pMapping[0] );
        for ( k = 1; k <= 4; k++ )
        {
            if ( pMapping[k] == -1 )
                Vec_IntPush( vMappingNew, -1 );
            else
            {
                assert( ~Gia_ManObj(pGia0, pMapping[k])->Value );
                Vec_IntPush( vMappingNew, Gia_ManObj(pGia0, pMapping[k])->Value );
            }
        }
    }
    // update mapping after the offset (currently not being done because it is not used)
    Vec_IntFree( p->pCnf->vMapping );  p->pCnf->vMapping    = vMappingNew;
    ABC_FREE( p->pCnf->pObj2Count );   p->pCnf->pObj2Count  = pObj2Count;
    ABC_FREE( p->pCnf->pObj2Clause );  p->pCnf->pObj2Clause = pObj2Clause;


    // count the number of variables
    p->nObjs = 1;
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( p->pCnf->pObj2Count[i] >= 0 )
            pObj->Value = p->nObjs++;
        else
            pObj->Value = ~0;

    // re-express CNF using new variable IDs
    pLits = p->pCnf->pClauses[0];
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
    {
        // find the original AIG object
        pObj = Gia_ManObj( pGia0, lit_var(pLits[i]) );
        assert( ~pObj->Value );
        // find the working AIG object
        pObj = Gia_ManObj( p->pGia, pObj->Value );
        assert( ~pObj->Value );
        // express literal in terms of LUT variables
        pLits[i] = toLitCond( pObj->Value, lit_sign(pLits[i]) );
    }

    // create objects 
    p->pObjs    = ABC_CALLOC( Gla_Obj_t, p->nObjs );
    p->pObj2Obj = ABC_FALLOC( unsigned, Gia_ManObjNum(p->pGia) );
//    p->pvRefis  = ABC_CALLOC( Vec_Int_t, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        p->pObj2Obj[i] = pObj->Value;
        if ( !~pObj->Value )
            continue;
        pGla = Gla_ManObj( p, pObj->Value );
        pGla->iGiaObj = i;
        pGla->fCompl0 = Gia_ObjFaninC0(pObj);
        pGla->fConst  = Gia_ObjIsConst0(pObj);
        pGla->fPi     = Gia_ObjIsPi(p->pGia, pObj);
        pGla->fPo     = Gia_ObjIsPo(p->pGia, pObj);
        pGla->fRi     = Gia_ObjIsRi(p->pGia, pObj);
        pGla->fRo     = Gia_ObjIsRo(p->pGia, pObj);
        pGla->fAnd    = Gia_ObjIsAnd(pObj);
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            pGla->nFanins = 1;
            pGla->Fanins[0] = Gia_ObjFanin0(pObj)->Value;
            continue;
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
//            Gla_ManCollectFanins( p, pGla, pObj->Value, p->vTemp );
//            pGla->nFanins = Vec_IntSize( p->vTemp );
//            memcpy( pGla->Fanins, Vec_IntArray(p->vTemp), sizeof(int) * Vec_IntSize(p->vTemp) );
            Offset = Vec_IntEntry( p->pCnf->vMapping, i );
            pMapping = Vec_IntEntryP( p->pCnf->vMapping, Offset );
            pGla->nFanins = 0;
            for ( k = 1; k <= 4; k++ )
                if ( pMapping[k] != -1 )
                    pGla->Fanins[ pGla->nFanins++ ] = Gia_ManObj(p->pGia, pMapping[k])->Value;
            continue;
        }
        assert( Gia_ObjIsRo(p->pGia, pObj) );
        pGla->nFanins   = 1;
        pGla->Fanins[0] = Gia_ObjFanin0( Gia_ObjRoToRi(p->pGia, pObj) )->Value;
        pGla->fCompl0   = Gia_ObjFaninC0( Gia_ObjRoToRi(p->pGia, pObj) );
    }
    p->pObjRoot = Gla_ManObj( p, Gia_ManPo(p->pGia, 0)->Value );
    // abstraction 
    assert( p->pGia->vGateClasses != NULL );
    Gla_ManForEachObj( p, pGla )
    {
        if ( Vec_IntEntry( p->pGia->vGateClasses, pGla->iGiaObj ) == 0 )
            continue;
        pGla->fAbs = 1;
        Vec_IntPush( p->vAbs, Gla_ObjId(p, pGla) );
    }
    // other 
    p->pSat        = sat_solver2_new();
    if ( pPars->fUseFullProof )
        p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    p->nSatVars  = 1;
    // start the refinement manager
//    p->pGia2 = Gia_ManDup( p->pGia );
    p->pRnm = Rnm_ManStart( p->pGia );
    return p;
}